

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall wabt::interp::Thread::DoConvert<float,int>(Thread *this,Ptr *out_trap)

{
  Value VVar1;
  Value value;
  
  VVar1 = Pop(this);
  value._8_8_ = VVar1._8_8_;
  value.i64_._4_4_ = 0;
  value.f32_ = (f32)(float)(int)VVar1.i32_;
  Push(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoConvert(Trap::Ptr* out_trap) {
  auto val = Pop<T>();
  if (std::is_integral<R>::value && std::is_floating_point<T>::value) {
    // Don't use std::isnan here because T may be a non-floating-point type.
    TRAP_IF(IsNaN(val), "invalid conversion to integer");
  }
  TRAP_UNLESS(CanConvert<R>(val), "integer overflow");
  Push<R>(Convert<R>(val));
  return RunResult::Ok;
}